

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

void __thiscall
QMakeSourceFileInfo::setDependencyPaths(QMakeSourceFileInfo *this,QList<QMakeLocalFileName> *l)

{
  bool bVar1;
  qsizetype qVar2;
  QList<QMakeLocalFileName> *in_RSI;
  long in_FS_OFFSET;
  int i;
  QList<QMakeLocalFileName> ll;
  QMakeLocalFileName *in_stack_ffffffffffffffa8;
  QListSpecialMethodsBase<QMakeLocalFileName> *in_stack_ffffffffffffffb0;
  int local_34;
  QList<QMakeLocalFileName> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QMakeLocalFileName *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QList<QMakeLocalFileName>::QList((QList<QMakeLocalFileName> *)0x1cfce8);
  local_34 = 0;
  while( true ) {
    qVar2 = QList<QMakeLocalFileName>::size(in_RSI);
    if (qVar2 <= local_34) break;
    QList<QMakeLocalFileName>::at
              ((QList<QMakeLocalFileName> *)in_stack_ffffffffffffffb0,
               (qsizetype)in_stack_ffffffffffffffa8);
    bVar1 = QListSpecialMethodsBase<QMakeLocalFileName>::contains<QMakeLocalFileName>
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) {
      QList<QMakeLocalFileName>::at
                ((QList<QMakeLocalFileName> *)in_stack_ffffffffffffffb0,
                 (qsizetype)in_stack_ffffffffffffffa8);
      QList<QMakeLocalFileName>::append
                ((QList<QMakeLocalFileName> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    local_34 = local_34 + 1;
  }
  QList<QMakeLocalFileName>::operator=
            (&local_20,(QList<QMakeLocalFileName> *)in_stack_ffffffffffffffa8);
  QList<QMakeLocalFileName>::~QList((QList<QMakeLocalFileName> *)0x1cfd7e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeSourceFileInfo::setDependencyPaths(const QList<QMakeLocalFileName> &l)
{
    // Ensure that depdirs does not contain the same paths several times, to minimize the stats
    QList<QMakeLocalFileName> ll;
    for (int i = 0; i < l.size(); ++i) {
        if (!ll.contains(l.at(i)))
            ll.append(l.at(i));
    }
    depdirs = ll;
}